

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UDataMemory * UDataMemory_createNewInstance_63(UErrorCode *pErr)

{
  UDataMemory *pUVar1;
  
  if (U_ZERO_ERROR < *pErr) {
    return (UDataMemory *)0x0;
  }
  pUVar1 = (UDataMemory *)uprv_malloc_63(0x38);
  if (pUVar1 == (UDataMemory *)0x0) {
    *pErr = U_MEMORY_ALLOCATION_ERROR;
    pUVar1 = (UDataMemory *)0x0;
  }
  else {
    pUVar1->toc = (void *)0x0;
    *(undefined8 *)&pUVar1->heapAllocated = 0;
    pUVar1->mapAddr = (void *)0x0;
    pUVar1->map = (void *)0x0;
    pUVar1->vFuncs = (commonDataFuncs *)0x0;
    pUVar1->pHeader = (DataHeader *)0x0;
    *(undefined8 *)&pUVar1->length = 0;
    pUVar1->length = -1;
    pUVar1->heapAllocated = '\x01';
  }
  return pUVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }